

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

void strRev(char *str)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  
  uVar2 = strlen(str);
  for (uVar3 = 1; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    bVar4 = str[uVar3 - 1];
    bVar1 = str[uVar2 - 1];
    str[uVar3 - 1] = bVar4 ^ bVar1;
    bVar4 = bVar4 ^ bVar1 ^ str[uVar2 - 1];
    str[uVar2 - 1] = bVar4;
    str[uVar3 - 1] = str[uVar3 - 1] ^ bVar4;
    uVar2 = uVar2 - 1;
  }
  return;
}

Assistant:

void strRev(char* str)
{
	size_t i, j;
	ASSERT(strIsValid(str));
	for (i = 0, j = strLen(str); i + 1 < j;)
	{
		str[i] ^= str[--j];
		str[j] ^= str[i];
		str[i++] ^= str[j];
	}
}